

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

void __thiscall spdlog::spdlog_ex::~spdlog_ex(spdlog_ex *this)

{
  exception *in_RDI;
  
  *(undefined ***)in_RDI = &PTR__spdlog_ex_001d9090;
  std::__cxx11::string::~string((string *)(in_RDI + 8));
  std::exception::~exception(in_RDI);
  return;
}

Assistant:

class SPDLOG_API spdlog_ex : public std::exception
{
public:
    explicit spdlog_ex(std::string msg);
    spdlog_ex(const std::string &msg, int last_errno);
    const char *what() const SPDLOG_NOEXCEPT override;

private:
    std::string msg_;
}